

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O0

void DumpAnchors(path *anchors_db_path,vector<CAddress,_std::allocator<CAddress>_> *anchors)

{
  long lVar1;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> logging_timer7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *in_stack_fffffffffffffec0;
  unsigned_long *in_stack_fffffffffffffee0;
  allocator<char> *fmt;
  undefined1 in_stack_fffffffffffffef7;
  allocator<char> *in_stack_fffffffffffffef8;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *in_stack_ffffffffffffff10;
  allocator<char> local_d9;
  size_type local_d8;
  allocator<char> local_c9 [25];
  ParamsWrapper<CAddress::SerParams,_const_std::vector<CAddress,_std::allocator<CAddress>_>_>
  *in_stack_ffffffffffffff50;
  path *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  fmt = local_c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RDI,(char *)in_RSI,in_stack_fffffffffffffef8);
  local_d8 = std::vector<CAddress,_std::allocator<CAddress>_>::size
                       ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffffeb8);
  tinyformat::format<unsigned_long>((char *)fmt,in_stack_fffffffffffffee0);
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::Timer
            (in_stack_ffffffffffffff10,in_RDI,in_RSI,(LogFlags)in_stack_fffffffffffffef8,
             (bool)in_stack_fffffffffffffef7);
  std::__cxx11::string::~string(in_stack_fffffffffffffeb8);
  std::__cxx11::string::~string(in_stack_fffffffffffffeb8);
  std::allocator<char>::~allocator(local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RDI,(char *)in_RSI,in_stack_fffffffffffffef8);
  CAddress::SerParams::operator()
            ((SerParams *)in_RDI,
             (vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffffec0);
  (anonymous_namespace)::
  SerializeFileDB<ParamsWrapper<CAddress::SerParams,std::vector<CAddress,std::allocator<CAddress>>const>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::__cxx11::string::~string(in_stack_fffffffffffffeb8);
  std::allocator<char>::~allocator(&local_d9);
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::~Timer(in_stack_fffffffffffffec0)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DumpAnchors(const fs::path& anchors_db_path, const std::vector<CAddress>& anchors)
{
    LOG_TIME_SECONDS(strprintf("Flush %d outbound block-relay-only peer addresses to anchors.dat", anchors.size()));
    SerializeFileDB("anchors", anchors_db_path, CAddress::V2_DISK(anchors));
}